

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O0

void compute_padded_integral_img_simd_early_cast_int(uint8_t *gray_image,integral_image *iimage)

{
  undefined1 (*pauVar1) [16];
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  undefined4 *puVar23;
  ulong uVar24;
  undefined8 *puVar25;
  undefined4 uVar26;
  int *in_RSI;
  long in_RDI;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  int i_7;
  int j_5;
  __m256 max_value_vec;
  float max_value_float;
  int index_last_element;
  __m256 prev_elements_in_row;
  int i_6;
  int j_4;
  int i_5;
  __m256 last_element_in_row_vec;
  float last_element_in_row_float;
  int j_3;
  __m256 v_iimage;
  __m256 v_float;
  __m256i v_int;
  size_t i_2;
  __m256 factor256;
  float prev_row_sum;
  uint32_t row_sum_1;
  __m128i add_row_sums;
  __m128 prev_iimage_float;
  __m128 prev_row_sums_cast;
  __m128i prev_row_sums;
  __m128i curr_row_sums_1;
  __m256i img_sad_sum_1;
  __m256i img_rep_mask_1;
  size_t i_4;
  __m256i row_sums_1;
  size_t j_2;
  __m128 factor;
  float *iimage_data;
  uint32_t row_sum;
  __m128i curr_row_sums;
  __m256i img_sad_sum;
  __m256i img_rep_mask;
  size_t i_3;
  __m256i row_sums;
  size_t aligned_width;
  uint32_t *iimage_idata;
  __m256i ZERO;
  __m256i PACK;
  __m256i MASK;
  int i_1;
  int j_1;
  int i;
  int j;
  __m256 zeros_float;
  int border;
  int height;
  int width;
  int data_height;
  int data_width;
  float *iimage_padded_data;
  int local_bc8;
  int local_bc4;
  int local_b4c;
  int local_b48;
  int local_b44;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  int local_b04;
  ulong local_a88;
  int local_a54;
  undefined8 local_a50;
  undefined8 uStack_a48;
  ulong local_9a8;
  undefined8 uStack_988;
  ulong local_978;
  int local_954;
  ulong local_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8c8;
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  undefined8 local_400;
  undefined8 uStack_3f8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  lVar6 = *(long *)(in_RSI + 6);
  iVar2 = in_RSI[4];
  iVar3 = in_RSI[5];
  iVar4 = *in_RSI;
  local_bc4 = in_RSI[1];
  iVar22 = (iVar2 - iVar4) / 2;
  for (local_824 = 0; local_82c = iVar22, local_824 < iVar22; local_824 = local_824 + 1) {
    for (local_828 = 0; local_828 < iVar2 + -7; local_828 = local_828 + 8) {
      puVar23 = (undefined4 *)(lVar6 + (long)(local_824 * iVar2) * 4 + (long)local_828 * 4);
      *puVar23 = 0;
      puVar23[1] = 0;
      puVar23[2] = 0;
      puVar23[3] = 0;
      puVar23[4] = 0;
      puVar23[5] = 0;
      puVar23[6] = 0;
      puVar23[7] = 0;
    }
    for (; local_828 < iVar2; local_828 = local_828 + 1) {
      *(undefined4 *)(lVar6 + (long)(local_824 * iVar2 + local_828) * 4) = 0;
    }
  }
  for (; local_82c < iVar3; local_82c = local_82c + 1) {
    for (local_830 = 0; local_830 < iVar22 + -7; local_830 = local_830 + 8) {
      puVar23 = (undefined4 *)(lVar6 + (long)(local_82c * iVar2) * 4 + (long)local_830 * 4);
      *puVar23 = 0;
      puVar23[1] = 0;
      puVar23[2] = 0;
      puVar23[3] = 0;
      puVar23[4] = 0;
      puVar23[5] = 0;
      puVar23[6] = 0;
      puVar23[7] = 0;
    }
    for (; local_830 < iVar22; local_830 = local_830 + 1) {
      *(undefined4 *)(lVar6 + (long)(local_82c * iVar2 + local_830) * 4) = 0;
    }
  }
  auVar12 = vpunpcklqdq_avx(ZEXT816(0xff),ZEXT816(0xffff));
  auVar13 = vpunpcklqdq_avx(ZEXT816(0xffffff),ZEXT816(0xffffffff));
  uStack_70 = auVar13._0_8_;
  uStack_68 = auVar13._8_8_;
  auVar13 = vpinsrd_avx(ZEXT416(0),2,1);
  auVar13 = vpinsrd_avx(auVar13,4,2);
  auVar13 = vpinsrd_avx(auVar13,6,3);
  auVar10 = vpinsrd_avx(ZEXT416(1),3,1);
  auVar10 = vpinsrd_avx(auVar10,5,2);
  auVar10 = vpinsrd_avx(auVar10,7,3);
  uStack_1f0 = auVar10._0_8_;
  uStack_1e8 = auVar10._8_8_;
  lVar7 = *(long *)(in_RSI + 2);
  uVar24 = (ulong)(iVar4 / 4 << 2);
  local_8e0 = 0;
  for (local_8e8 = 0; local_8e8 < uVar24; local_8e8 = local_8e8 + 4) {
    uVar5 = *(uint *)(in_RDI + local_8e8);
    auVar10 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
    auVar10 = vpinsrd_avx(auVar10,uVar5,2);
    auVar10 = vpinsrd_avx(auVar10,uVar5,3);
    auVar11 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
    auVar11 = vpinsrd_avx(auVar11,uVar5,2);
    auVar11 = vpinsrd_avx(auVar11,uVar5,3);
    uStack_1b0 = auVar11._0_8_;
    uStack_1a8 = auVar11._8_8_;
    auVar18._16_8_ = uStack_1b0;
    auVar18._0_16_ = auVar10;
    auVar18._24_8_ = uStack_1a8;
    auVar14._16_8_ = uStack_70;
    auVar14._0_16_ = auVar12;
    auVar14._24_8_ = uStack_68;
    auVar14 = vpand_avx2(auVar18,auVar14);
    auVar14 = vpsadbw_avx2(auVar14,ZEXT1632(ZEXT816(0)));
    auVar19._8_8_ = local_8e0;
    auVar19._0_8_ = local_8e0;
    auVar19._16_8_ = local_8e0;
    auVar19._24_8_ = local_8e0;
    auVar14 = vpaddd_avx2(auVar19,auVar14);
    uStack_8c8 = auVar14._24_8_;
    auVar21._16_8_ = uStack_1f0;
    auVar21._0_16_ = auVar13;
    auVar21._24_8_ = uStack_1e8;
    auVar14 = vpermd_avx2(auVar21,auVar14);
    local_400 = auVar14._0_8_;
    uStack_3f8 = auVar14._8_8_;
    puVar25 = (undefined8 *)(lVar7 + local_8e8 * 4);
    *puVar25 = local_400;
    puVar25[1] = uStack_3f8;
    local_8e0 = uStack_8c8;
  }
  local_954 = *(int *)(lVar7 + (local_8e8 - 1) * 4);
  for (; local_8e8 < (ulong)(long)iVar4; local_8e8 = local_8e8 + 1) {
    local_954 = (uint)*(byte *)(in_RDI + local_8e8) + local_954;
    *(int *)(lVar7 + local_8e8 * 4) = local_954;
  }
  lVar8 = *(long *)(in_RSI + 2);
  for (local_978 = 1; local_978 < (ulong)(long)local_bc4; local_978 = local_978 + 1) {
    auVar27 = ZEXT1632(ZEXT816(0));
    for (local_9a8 = 0; auVar29 = ZEXT3264(auVar27), local_9a8 < uVar24; local_9a8 = local_9a8 + 4)
    {
      uVar5 = *(uint *)(local_9a8 + in_RDI + local_978 * (long)iVar4);
      auVar10 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
      auVar10 = vpinsrd_avx(auVar10,uVar5,2);
      auVar10 = vpinsrd_avx(auVar10,uVar5,3);
      auVar11 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
      auVar11 = vpinsrd_avx(auVar11,uVar5,2);
      auVar11 = vpinsrd_avx(auVar11,uVar5,3);
      uStack_170 = auVar11._0_8_;
      uStack_168 = auVar11._8_8_;
      auVar17._16_8_ = uStack_170;
      auVar17._0_16_ = auVar10;
      auVar17._24_8_ = uStack_168;
      auVar16._16_8_ = uStack_70;
      auVar16._0_16_ = auVar12;
      auVar16._24_8_ = uStack_68;
      auVar14 = vpand_avx2(auVar17,auVar16);
      auVar14 = vpsadbw_avx2(auVar14,ZEXT1632(ZEXT816(0)));
      auVar14 = vpaddd_avx2(auVar27,auVar14);
      uStack_988 = auVar14._24_8_;
      auVar20._16_8_ = uStack_1f0;
      auVar20._0_16_ = auVar13;
      auVar20._24_8_ = uStack_1e8;
      auVar14 = vpermd_avx2(auVar20,auVar14);
      pauVar1 = (undefined1 (*) [16])(lVar7 + (local_978 - 1) * (long)iVar2 * 4 + local_9a8 * 4);
      auVar11 = *pauVar1;
      auVar10 = vcvtdq2ps_avx(*pauVar1);
      local_240 = auVar10._0_4_;
      fStack_23c = auVar10._4_4_;
      fStack_238 = auVar10._8_4_;
      fStack_234 = auVar10._12_4_;
      puVar25 = (undefined8 *)(lVar8 + (local_978 - 1) * (long)iVar2 * 4 + local_9a8 * 4);
      *puVar25 = CONCAT44(fStack_23c * 0.003921569,local_240 * 0.003921569);
      puVar25[1] = CONCAT44(fStack_234 * 0.003921569,fStack_238 * 0.003921569);
      auVar10 = vpaddd_avx(auVar14._0_16_,auVar11);
      puVar25 = (undefined8 *)(lVar7 + local_978 * (long)iVar2 * 4 + local_9a8 * 4);
      local_a50 = auVar10._0_8_;
      uStack_a48 = auVar10._8_8_;
      *puVar25 = local_a50;
      puVar25[1] = uStack_a48;
      auVar27._8_8_ = uStack_988;
      auVar27._0_8_ = uStack_988;
      auVar27._16_8_ = uStack_988;
      auVar27._24_8_ = uStack_988;
    }
    local_a54 = *(int *)(lVar7 + (local_978 * (long)iVar2 + local_9a8 + -1) * 4) -
                *(int *)(lVar7 + ((local_978 - 1) * (long)iVar2 + local_9a8 + -1) * 4);
    for (; local_9a8 < (ulong)(long)iVar4; local_9a8 = local_9a8 + 1) {
      local_a54 = local_a54 + (uint)*(byte *)(in_RDI + local_978 * (long)iVar4 + local_9a8);
      auVar10 = vcvtusi2ss_avx512f(auVar29._0_16_,
                                   *(undefined4 *)
                                    (lVar7 + ((local_978 - 1) * (long)iVar2 + local_9a8) * 4));
      auVar11 = vcvtusi2ss_avx512f(auVar10,local_a54);
      uVar26 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar11._0_4_ + auVar10._0_4_)));
      *(undefined4 *)(lVar7 + (local_978 * (long)iVar2 + local_9a8) * 4) = uVar26;
      fVar9 = auVar10._0_4_ * 0.003921569;
      auVar29 = ZEXT464((uint)fVar9);
      *(float *)(lVar8 + ((local_978 - 1) * (long)iVar2 + local_9a8) * 4) = fVar9;
    }
  }
  auVar13 = vinsertps_avx(ZEXT416(0x3b808081),ZEXT416(0x3b808081),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3b808081),0x20);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3b808081),0x30);
  auVar10 = vinsertps_avx(ZEXT416(0x3b808081),ZEXT416(0x3b808081),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3b808081),0x20);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3b808081),0x30);
  auVar28._16_16_ = auVar13;
  auVar28._0_16_ = auVar10;
  for (local_a88 = 0; auVar29 = ZEXT3264(auVar28), local_a88 < (ulong)(long)(iVar4 + -7);
      local_a88 = local_a88 + 8) {
    auVar14 = vcvtdq2ps_avx(*(undefined1 (*) [32])
                             (lVar7 + (long)((local_bc4 + -1) * iVar2) * 4 + local_a88 * 4));
    local_2a0 = auVar10._0_4_;
    fStack_29c = auVar10._4_4_;
    fStack_298 = auVar10._8_4_;
    fStack_294 = auVar10._12_4_;
    fStack_290 = auVar13._0_4_;
    fStack_28c = auVar13._4_4_;
    fStack_288 = auVar13._8_4_;
    uStack_284 = auVar13._12_4_;
    local_2c0 = auVar14._0_4_;
    fStack_2bc = auVar14._4_4_;
    fStack_2b8 = auVar14._8_4_;
    fStack_2b4 = auVar14._12_4_;
    fStack_2b0 = auVar14._16_4_;
    fStack_2ac = auVar14._20_4_;
    fStack_2a8 = auVar14._24_4_;
    auVar28._4_4_ = fStack_29c * fStack_2bc;
    auVar28._0_4_ = local_2a0 * local_2c0;
    auVar28._12_4_ = fStack_294 * fStack_2b4;
    auVar28._8_4_ = fStack_298 * fStack_2b8;
    auVar28._20_4_ = fStack_28c * fStack_2ac;
    auVar28._16_4_ = fStack_290 * fStack_2b0;
    auVar28._28_4_ = uStack_284;
    auVar28._24_4_ = fStack_288 * fStack_2a8;
    *(undefined1 (*) [32])(lVar8 + (long)((local_bc4 + -1) * iVar2) * 4 + local_a88 * 4) = auVar28;
  }
  for (; local_b04 = iVar22, local_a88 < (ulong)(long)iVar4; local_a88 = local_a88 + 1) {
    auVar13 = vcvtusi2ss_avx512f(auVar29._0_16_,
                                 *(undefined4 *)
                                  (lVar7 + ((long)((local_bc4 + -1) * iVar2) + local_a88) * 4));
    fVar9 = auVar13._0_4_ * 0.003921569;
    auVar29 = ZEXT464((uint)fVar9);
    *(float *)(lVar8 + ((long)((local_bc4 + -1) * iVar2) + local_a88) * 4) = fVar9;
  }
  for (; local_b04 < iVar22 + local_bc4; local_b04 = local_b04 + 1) {
    uVar5 = *(uint *)(lVar6 + (long)(iVar4 + -1 + local_b04 * iVar2 + iVar22) * 4);
    auVar13 = vinsertps_avx(ZEXT416(uVar5),ZEXT416(uVar5),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar5),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar5),0x30);
    auVar10 = vinsertps_avx(ZEXT416(uVar5),ZEXT416(uVar5),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar5),0x20);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar5),0x30);
    for (local_b44 = iVar4 + iVar22; local_b44 < iVar2 + -7; local_b44 = local_b44 + 8) {
      uStack_b30 = auVar13._0_8_;
      uStack_b28 = auVar13._8_8_;
      auVar15._16_8_ = uStack_b30;
      auVar15._0_16_ = auVar10;
      auVar15._24_8_ = uStack_b28;
      *(undefined1 (*) [32])(lVar6 + (long)(local_b04 * iVar2) * 4 + (long)local_b44 * 4) = auVar15;
    }
    for (; local_b44 < iVar2; local_b44 = local_b44 + 1) {
      *(uint *)(lVar6 + (long)(local_b04 * iVar2 + local_b44) * 4) = uVar5;
    }
  }
  for (local_b48 = iVar22 + local_bc4; local_b4c = iVar22, local_b48 < iVar3;
      local_b48 = local_b48 + 1) {
    for (; local_b4c < iVar4 + iVar22 + -7; local_b4c = local_b4c + 8) {
      *(undefined1 (*) [32])(lVar6 + (long)(local_b48 * iVar2) * 4 + (long)local_b4c * 4) =
           *(undefined1 (*) [32])
            (lVar6 + (long)((local_b48 + -1) * iVar2) * 4 + (long)local_b4c * 4);
    }
    for (; local_b4c < iVar4 + iVar22; local_b4c = local_b4c + 1) {
      *(undefined4 *)(lVar6 + (long)(local_b48 * iVar2 + local_b4c) * 4) =
           *(undefined4 *)(lVar6 + (long)((local_b48 + -1) * iVar2 + local_b4c) * 4);
    }
  }
  uVar5 = *(uint *)(lVar6 + (long)(iVar4 + -1 + (iVar22 + -1 + local_bc4) * iVar2 + iVar22) * 4);
  auVar13 = vinsertps_avx(ZEXT416(uVar5),ZEXT416(uVar5),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar5),0x20);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar5),0x30);
  auVar10 = vinsertps_avx(ZEXT416(uVar5),ZEXT416(uVar5),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar5),0x20);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(uVar5),0x30);
  local_c0 = auVar10._0_8_;
  uStack_b8 = auVar10._8_8_;
  uStack_b0 = auVar13._0_8_;
  uStack_a8 = auVar13._8_8_;
  for (local_bc4 = iVar22 + local_bc4; local_bc4 < iVar3; local_bc4 = local_bc4 + 1) {
    for (local_bc8 = iVar22 + iVar4; local_bc8 < iVar2 + -7; local_bc8 = local_bc8 + 8) {
      puVar25 = (undefined8 *)(lVar6 + (long)(local_bc4 * iVar2) * 4 + (long)local_bc8 * 4);
      *puVar25 = local_c0;
      puVar25[1] = uStack_b8;
      puVar25[2] = uStack_b0;
      puVar25[3] = uStack_a8;
    }
    for (; local_bc8 < iVar2; local_bc8 = local_bc8 + 1) {
      *(uint *)(lVar6 + (long)(local_bc4 * iVar2 + local_bc8) * 4) = uVar5;
    }
  }
  return;
}

Assistant:

void compute_padded_integral_img_simd_early_cast_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    float *iimage_padded_data = iimage->padded_data;

    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    __m256 zeros_float = _mm256_setzero_ps();

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        int i = 0;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        int i = 0;
        for (; i < border - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
        __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
        //__m256i ZERO = _mm256_set1_epi32(0);
        __m256i ZERO = _mm256_setzero_si256();
        
        // Implementation adapted from:
        // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
        // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

        uint32_t *iimage_idata = (uint32_t *) iimage->data;

        size_t aligned_width = width / 4 * 4;

        {
            __m256i row_sums = ZERO;
            size_t i = 0;
            for(; i < aligned_width; i+=4) {

                // If (gray_image + i) has following uint8_t pixels: a b c d
                // a0000000 ab000000 abc00000 abcd0000
                __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
                
                // Summing together blocks of 8 uint8_t's and storing results
                // uint32_t eeee = a
                // uint32_t ffff = a + b
                // uint32_t gggg = a + b + c
                // uint32_t hhhh = a + b + c + d
                // eeee0000 ffff0000 gggg0000 hhhh0000
                __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

                // Updating row_sum by adding previously computed img_sad_sum
                //   eeee0000 ffff0000 hhhh0000 hhhh0000
                // + iiii**** jjjj**** kkkk**** llll****
                // -------------------------------------
                //   mmmm**** nnnn**** oooo**** pppp****
                row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

                // Permuting row_sum from first row to second and cutting off upper 128 bits
                // mmmm**** nnnn**** oooo**** pppp****
                // mmmmnnnn oooopppp ******** ********
                __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
                
                // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
                // 
                _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
                //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
                
                // Updating row_sums to only include highest of four values (pppp)
                // mmmm**** nnnn**** oooo**** pppp****
                // pppp**** pppp**** pppp**** pppp****
                row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

            }
            uint32_t row_sum = iimage_idata[i - 1];
            for (; i < width; ++i) {
                row_sum += gray_image[i];
                iimage_idata[i] = row_sum;
            }
        }

        float *iimage_data = iimage->data;
        __m128 factor = _mm_set1_ps(1.0f / 255.0f);

        for(size_t j = 1; j < height; ++j) {

            __m256i row_sums = ZERO;

            size_t i = 0;
            for(; i < aligned_width; i+=4) {

                // If (gray_image + i) has following uint8_t pixels: a b c d
                // a0000000 ab000000 abc00000 abcd0000
                __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
                
                // Summing together blocks of 8 uint8_t's and storing results
                // uint32_t eeee = a
                // uint32_t ffff = a + b
                // uint32_t gggg = a + b + c
                // uint32_t hhhh = a + b + c + d
                // eeee0000 ffff0000 gggg0000 hhhh0000
                __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

                // Updating row_sum by adding previously computed img_sad_sum
                //   eeee0000 ffff0000 hhhh0000 hhhh0000
                // + iiii**** jjjj**** kkkk**** llll****
                // -------------------------------------
                //   mmmm**** nnnn**** oooo**** pppp****
                row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

                // Permuting row_sum from first row to second and cutting off upper 128 bits
                // mmmm**** nnnn**** oooo**** pppp****
                // mmmmnnnn oooopppp ******** ********
                __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

                // Loading row_sum from previous row
                __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
                //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

                // AVX512 only :(
                //__m128 prev_row_sums_cast = _mm_cvtepu32_ps(prev_row_sums);
                __m128 prev_row_sums_cast = _mm_cvtepi32_ps(prev_row_sums);
                //__128 prev_row_sums_cast = _my_mm_cvtepu32_ps(prev_row_sums);

                // Multiplying float version of previous row sum converted with (1.0f/255.0f) 
                __m128 prev_iimage_float = _mm_mul_ps(factor, prev_row_sums_cast);

                // Storing float of previous row sum back to memory as final integral image value
                _mm_storeu_ps(iimage_data +(j-1) * data_width + i, prev_iimage_float);

                // Adding curr_row_sums with prev_row_sums
                __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

                // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
                _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
                //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
                
                // Updating row_sums to only include highest of four values (pppp)
                // mmmm**** nnnn**** oooo**** pppp****
                // pppp**** pppp**** pppp**** pppp****
                row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

            }

            uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
            for (; i < width; ++i) {
                row_sum += gray_image[j * width + i];
                float prev_row_sum = iimage_idata[(j-1) * data_width + i];
                iimage_idata[j * data_width + i] = row_sum + prev_row_sum;
                iimage_data[(j-1) * data_width + i] = (1.0f / 255.0f) * ((float) prev_row_sum);
            }

        }

        // Converting last row to floats
        __m256 factor256 = _mm256_set1_ps(1.0f / 255.0f);
        size_t i = 0;
        for (; i < width - 7; i+=8) { // TODO: Check if -7 correct here

            __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + (height - 1) * data_width + i));
            //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

            // AVX512 only :(
            //__m256 v_float = _mm256_cvtepu32_ps(v_int);
            __m256 v_float = _mm256_cvtepi32_ps(v_int);
            //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

            // Multiplying converted float with (1.0f/255.0f) 
            __m256 v_iimage = _mm256_mul_ps(factor256, v_float);

            // Storing value back to memory
            _mm256_storeu_ps(iimage_data + (height - 1) * data_width + i, v_iimage);

        } 

        for (; i < width; ++i) {
            iimage_data[(height - 1) * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[(height - 1) * data_width + i]);
        }

    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row_float = iimage_padded_data[j * data_width + border + width - 1];
        __m256 last_element_in_row_vec = _mm256_set1_ps(last_element_in_row_float);
        int i = width + border;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, last_element_in_row_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row_float;
        }
    }

    // BLOCK D   
    for (int j = border + height; j < data_height; ++j) {
        int i = border;
        for (; i < width + border - 7; i+=8) {
            __m256 prev_elements_in_row = _mm256_loadu_ps(iimage_padded_data + (j-1) * data_width + i);
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row);
        }
        for (; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }
 
// TODO: WRITE SECOND VERSION WITH COLMAJOR
/*  
    int i = border;
    for (; i < width + border - 7; i+=8) {
        __m256 prev_elements_in_row_vec = _mm256_loadu_ps(iimage_padded_data + (border + height - 1) * data_width + i);
        for (int j = border + height; j < data_height; ++j) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row_vec);
        }
    }
    for (; i < width + border; ++i) {
        float prev_elements_in_row_float = iimage_padded_data[(border + height - 1) * data_width + i];
        for (int j = border + height; j < data_height; ++j) {
            iimage_padded_data[j * data_width + i] = prev_elements_in_row_float;
        }
    }
*/    

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value_float = iimage_padded_data[index_last_element];
    __m256 max_value_vec = _mm256_set1_ps(max_value_float);
    for (int j = border + height; j < data_height; ++j) {
        int i = border + width;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, max_value_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value_float;
        }
    }
    
}